

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * compute_vla_size(C_Parser *parser,C_Type *ty,C_Token *tok)

{
  int iVar1;
  C_Type *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  C_Obj *pCVar6;
  C_Node *pCVar7;
  C_Node *pCVar8;
  C_Node *local_38;
  
  pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar3->kind = ND_NULL_EXPR;
  pCVar3->tok = tok;
  pCVar5 = pCVar3;
  if (ty->base != (C_Type *)0x0) {
    pCVar4 = compute_vla_size(parser,ty->base,tok);
    pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar5->kind = ND_COMMA;
    pCVar5->tok = tok;
    pCVar5->lhs = pCVar3;
    pCVar5->rhs = pCVar4;
  }
  pCVar3 = pCVar5;
  if (ty->kind == TY_VLA) {
    pCVar2 = ty->base;
    if (pCVar2->kind == TY_VLA) {
      pCVar6 = pCVar2->vla_size;
      local_38 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      local_38->kind = ND_VAR;
      local_38->tok = tok;
      local_38->var = pCVar6;
    }
    else {
      iVar1 = pCVar2->size;
      local_38 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      local_38->kind = ND_NUM;
      local_38->tok = tok;
      local_38->val = (long)iVar1;
    }
    pCVar6 = new_var(parser,"",C_ty_ulong);
    pCVar6->is_local = true;
    pCVar6->next = parser->locals;
    parser->locals = pCVar6;
    ty->vla_size = pCVar6;
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_VAR;
    pCVar4->tok = tok;
    pCVar4->var = pCVar6;
    pCVar3 = ty->vla_len;
    pCVar7 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar7->kind = ND_MUL;
    pCVar7->tok = tok;
    pCVar7->lhs = pCVar3;
    pCVar7->rhs = local_38;
    pCVar8 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar8->kind = ND_ASSIGN;
    pCVar8->tok = tok;
    pCVar8->lhs = pCVar4;
    pCVar8->rhs = pCVar7;
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_COMMA;
    pCVar3->tok = tok;
    pCVar3->lhs = pCVar5;
    pCVar3->rhs = pCVar8;
  }
  return pCVar3;
}

Assistant:

static C_Node *compute_vla_size(C_Parser *parser, C_Type *ty, C_Token *tok) {
  C_Node *node = new_node(parser, ND_NULL_EXPR, tok);
  if (ty->base)
    node = new_binary(parser, ND_COMMA, node, compute_vla_size(parser, ty->base, tok), tok);

  if (ty->kind != TY_VLA)
    return node;

  C_Node *base_sz;
  if (ty->base->kind == TY_VLA)
    base_sz = new_var_node(parser, ty->base->vla_size, tok);
  else
    base_sz = new_num(parser, ty->base->size, tok);

  ty->vla_size = new_lvar(parser, "", C_ty_ulong);
  C_Node *expr = new_binary(parser, ND_ASSIGN, new_var_node(parser, ty->vla_size, tok),
                          new_binary(parser, ND_MUL, ty->vla_len, base_sz, tok),
                          tok);
  return new_binary(parser, ND_COMMA, node, expr, tok);
}